

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O3

uint Security::CalculateConstSize(Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  undefined4 uVar4;
  ulong uVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined4 *puVar6;
  undefined7 extraout_var_01;
  long lVar7;
  char *message;
  char *error;
  uint lineNumber;
  _func_int **pp_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar11 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar12 [16];
  undefined8 extraout_XMM1_Qb_00;
  undefined8 extraout_XMM1_Qb_01;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  long lVar21;
  undefined1 auVar22 [16];
  long lVar25;
  undefined1 auVar23 [16];
  long lVar26;
  undefined1 auVar24 [16];
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  undefined1 auVar30 [16];
  long lVar32;
  undefined1 auVar31 [16];
  long lVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  
  bVar2 = DontEncode(opnd);
  if (bVar2) {
    return 0;
  }
  OVar3 = IR::Opnd::GetKind(opnd);
  switch(OVar3) {
  case OpndKindIntConst:
    OVar3 = IR::Opnd::GetKind(opnd);
    if (OVar3 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb;
      in_XMM1._0_8_ = extraout_XMM1_Qa;
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar2) goto LAB_00623411;
      *puVar6 = 0;
    }
    pp_Var8 = opnd[1]._vptr_Opnd;
    auVar9._8_4_ = (int)pp_Var8;
    auVar9._0_8_ = pp_Var8;
    auVar9._12_4_ = (int)((ulong)pp_Var8 >> 0x20);
    auVar12 = pmovsxbq(in_XMM1,0x302);
    auVar15 = pmovsxbq(in_XMM2,0x100);
    lVar7 = 8;
    auVar19 = pmovsxbq(in_XMM7,0x404);
    auVar11 = (undefined1  [16])0x0;
    do {
      lVar33 = auVar12._8_8_;
      lVar28 = auVar12._0_8_ << 3;
      lVar32 = lVar33 << 3;
      lVar25 = auVar15._8_8_;
      lVar21 = auVar15._0_8_ << 3;
      lVar26 = lVar25 << 3;
      auVar35._0_8_ = 0x8000000000000000 >> lVar21;
      auVar35._8_8_ = 0x8000000000000000 >> lVar21;
      auVar47._0_8_ = 0x8000000000000000 >> lVar26;
      auVar47._8_8_ = 0x8000000000000000 >> lVar26;
      auVar18 = pblendw(auVar47,auVar35,0xf);
      uVar29 = auVar9._8_8_;
      auVar36._0_8_ = (ulong)pp_Var8 >> lVar21;
      auVar36._8_8_ = uVar29 >> lVar21;
      auVar22._0_8_ = (ulong)pp_Var8 >> lVar26;
      auVar22._8_8_ = uVar29 >> lVar26;
      auVar14 = pblendw(auVar22,auVar36,0xf);
      uVar5 = SUB168(auVar14 ^ auVar18,0) - auVar18._0_8_;
      uVar27 = SUB168(auVar14 ^ auVar18,8) - auVar18._8_8_;
      auVar37._0_8_ = 0x8000000000000000 >> lVar28;
      auVar37._8_8_ = 0x8000000000000000 >> lVar28;
      auVar48._0_8_ = 0x8000000000000000 >> lVar32;
      auVar48._8_8_ = 0x8000000000000000 >> lVar32;
      auVar18 = pblendw(auVar48,auVar37,0xf);
      auVar38._0_8_ = (ulong)pp_Var8 >> lVar28;
      auVar38._8_8_ = uVar29 >> lVar28;
      auVar30._0_8_ = (ulong)pp_Var8 >> lVar32;
      auVar30._8_8_ = uVar29 >> lVar32;
      auVar14 = pblendw(auVar30,auVar38,0xf);
      uVar29 = SUB168(auVar14 ^ auVar18,0) - auVar18._0_8_;
      uVar34 = SUB168(auVar14 ^ auVar18,8) - auVar18._8_8_;
      auVar24._0_4_ =
           auVar11._0_4_ - (~-(uint)(((uint)uVar5 & 0xff) == 0xff) & -(uint)((uVar5 & 0xff) != 0));
      auVar24._4_4_ =
           auVar11._4_4_ - (~-(uint)(((uint)uVar27 & 0xff) == 0xff) & -(uint)((uVar27 & 0xff) != 0))
      ;
      auVar24._8_4_ =
           auVar11._8_4_ - (~-(uint)(((uint)uVar29 & 0xff) == 0xff) & -(uint)((uVar29 & 0xff) != 0))
      ;
      auVar24._12_4_ =
           auVar11._12_4_ -
           (~-(uint)(((uint)uVar34 & 0xff) == 0xff) & -(uint)((uVar34 & 0xff) != 0));
      auVar15._0_8_ = auVar15._0_8_ + auVar19._0_8_;
      auVar15._8_8_ = lVar25 + auVar19._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + auVar19._0_8_;
      auVar12._8_8_ = lVar33 + auVar19._8_8_;
      lVar7 = lVar7 + -4;
      auVar11 = auVar24;
    } while (lVar7 != 0);
    break;
  case OpndKindInt64Const:
    OVar3 = IR::Opnd::GetKind(opnd);
    if (OVar3 != OpndKindInt64Const) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb_01;
      in_XMM1._0_8_ = extraout_XMM1_Qa_01;
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xe4,"(this->IsInt64ConstOpnd())","Bad call to AsInt64ConstOpnd()");
      if (!bVar2) goto LAB_00623411;
      *puVar6 = 0;
    }
    pp_Var8 = opnd[1]._vptr_Opnd;
    auVar10._8_4_ = (int)pp_Var8;
    auVar10._0_8_ = pp_Var8;
    auVar10._12_4_ = (int)((ulong)pp_Var8 >> 0x20);
    auVar13 = pmovsxbq(in_XMM1,0x302);
    auVar16 = pmovsxbq(in_XMM2,0x100);
    lVar7 = 8;
    auVar19 = pmovsxbq(in_XMM7,0x404);
    auVar11 = (undefined1  [16])0x0;
    do {
      lVar33 = auVar13._8_8_;
      lVar28 = auVar13._0_8_ << 3;
      lVar32 = lVar33 << 3;
      lVar26 = auVar16._8_8_;
      lVar21 = auVar16._0_8_ << 3;
      lVar25 = lVar26 << 3;
      auVar39._0_8_ = 0x8000000000000000 >> lVar21;
      auVar39._8_8_ = 0x8000000000000000 >> lVar21;
      auVar49._0_8_ = 0x8000000000000000 >> lVar25;
      auVar49._8_8_ = 0x8000000000000000 >> lVar25;
      auVar18 = pblendw(auVar49,auVar39,0xf);
      uVar29 = auVar10._8_8_;
      auVar40._0_8_ = (ulong)pp_Var8 >> lVar21;
      auVar40._8_8_ = uVar29 >> lVar21;
      auVar23._0_8_ = (ulong)pp_Var8 >> lVar25;
      auVar23._8_8_ = uVar29 >> lVar25;
      auVar14 = pblendw(auVar23,auVar40,0xf);
      uVar5 = SUB168(auVar14 ^ auVar18,0) - auVar18._0_8_;
      uVar27 = SUB168(auVar14 ^ auVar18,8) - auVar18._8_8_;
      auVar41._0_8_ = 0x8000000000000000 >> lVar28;
      auVar41._8_8_ = 0x8000000000000000 >> lVar28;
      auVar50._0_8_ = 0x8000000000000000 >> lVar32;
      auVar50._8_8_ = 0x8000000000000000 >> lVar32;
      auVar18 = pblendw(auVar50,auVar41,0xf);
      auVar42._0_8_ = (ulong)pp_Var8 >> lVar28;
      auVar42._8_8_ = uVar29 >> lVar28;
      auVar31._0_8_ = (ulong)pp_Var8 >> lVar32;
      auVar31._8_8_ = uVar29 >> lVar32;
      auVar14 = pblendw(auVar31,auVar42,0xf);
      uVar29 = SUB168(auVar14 ^ auVar18,0) - auVar18._0_8_;
      uVar34 = SUB168(auVar14 ^ auVar18,8) - auVar18._8_8_;
      auVar24._0_4_ =
           auVar11._0_4_ - (~-(uint)(((uint)uVar5 & 0xff) == 0xff) & -(uint)((uVar5 & 0xff) != 0));
      auVar24._4_4_ =
           auVar11._4_4_ - (~-(uint)(((uint)uVar27 & 0xff) == 0xff) & -(uint)((uVar27 & 0xff) != 0))
      ;
      auVar24._8_4_ =
           auVar11._8_4_ - (~-(uint)(((uint)uVar29 & 0xff) == 0xff) & -(uint)((uVar29 & 0xff) != 0))
      ;
      auVar24._12_4_ =
           auVar11._12_4_ -
           (~-(uint)(((uint)uVar34 & 0xff) == 0xff) & -(uint)((uVar34 & 0xff) != 0));
      auVar16._0_8_ = auVar16._0_8_ + auVar19._0_8_;
      auVar16._8_8_ = lVar26 + auVar19._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + auVar19._0_8_;
      auVar13._8_8_ = lVar33 + auVar19._8_8_;
      lVar7 = lVar7 + -4;
      auVar11 = auVar24;
    } while (lVar7 != 0);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Security.cpp"
                       ,0x15e,"((0))","(0)");
    if (bVar2) {
      *puVar6 = 0;
      return 0;
    }
    goto LAB_00623411;
  case OpndKindAddr:
    OVar3 = IR::Opnd::GetKind(opnd);
    if (OVar3 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb_00;
      in_XMM1._0_8_ = extraout_XMM1_Qa_00;
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar2) goto LAB_00623411;
      *puVar6 = 0;
    }
    pp_Var8 = opnd[2]._vptr_Opnd;
    uVar5 = (ulong)pp_Var8 & 0x1ffff00000000;
    if (uVar5 == 0x1000000000000 || ((ulong)pp_Var8 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pp_Var8 & 0xffff000000000000) != 0x1000000000000) {
        auVar19._8_4_ = (int)pp_Var8;
        auVar19._0_8_ = pp_Var8;
        auVar19._12_4_ = (int)((ulong)pp_Var8 >> 0x20);
        auVar14 = pmovsxbq(in_XMM1,0x302);
        auVar18 = pmovsxbq(in_XMM2,0x100);
        lVar7 = 8;
        auVar20 = pmovsxbq(in_XMM7,0x404);
        auVar11 = (undefined1  [16])0x0;
        do {
          lVar32 = auVar14._8_8_;
          lVar28 = auVar14._0_8_ << 3;
          lVar33 = lVar32 << 3;
          lVar25 = auVar18._8_8_;
          lVar21 = auVar18._0_8_ << 3;
          lVar26 = lVar25 << 3;
          auVar43._0_8_ = 0x8000000000000000 >> lVar21;
          auVar43._8_8_ = 0x8000000000000000 >> lVar21;
          auVar51._0_8_ = 0x8000000000000000 >> lVar26;
          auVar51._8_8_ = 0x8000000000000000 >> lVar26;
          auVar52 = pblendw(auVar51,auVar43,0xf);
          uVar29 = auVar19._8_8_;
          auVar44._0_8_ = (ulong)pp_Var8 >> lVar21;
          auVar44._8_8_ = uVar29 >> lVar21;
          auVar54._0_8_ = (ulong)pp_Var8 >> lVar26;
          auVar54._8_8_ = uVar29 >> lVar26;
          auVar24 = pblendw(auVar54,auVar44,0xf);
          uVar5 = SUB168(auVar24 ^ auVar52,0) - auVar52._0_8_;
          uVar27 = SUB168(auVar24 ^ auVar52,8) - auVar52._8_8_;
          auVar45._0_8_ = 0x8000000000000000 >> lVar28;
          auVar45._8_8_ = 0x8000000000000000 >> lVar28;
          auVar53._0_8_ = 0x8000000000000000 >> lVar33;
          auVar53._8_8_ = 0x8000000000000000 >> lVar33;
          auVar54 = pblendw(auVar53,auVar45,0xf);
          auVar46._0_8_ = (ulong)pp_Var8 >> lVar28;
          auVar46._8_8_ = uVar29 >> lVar28;
          auVar52._0_8_ = (ulong)pp_Var8 >> lVar33;
          auVar52._8_8_ = uVar29 >> lVar33;
          auVar24 = pblendw(auVar52,auVar46,0xf);
          uVar29 = SUB168(auVar24 ^ auVar54,0) - auVar54._0_8_;
          uVar34 = SUB168(auVar24 ^ auVar54,8) - auVar54._8_8_;
          auVar24._0_4_ =
               auVar11._0_4_ -
               (~-(uint)(((uint)uVar5 & 0xff) == 0xff) & -(uint)((uVar5 & 0xff) != 0));
          auVar24._4_4_ =
               auVar11._4_4_ -
               (~-(uint)(((uint)uVar27 & 0xff) == 0xff) & -(uint)((uVar27 & 0xff) != 0));
          auVar24._8_4_ =
               auVar11._8_4_ -
               (~-(uint)(((uint)uVar29 & 0xff) == 0xff) & -(uint)((uVar29 & 0xff) != 0));
          auVar24._12_4_ =
               auVar11._12_4_ -
               (~-(uint)(((uint)uVar34 & 0xff) == 0xff) & -(uint)((uVar34 & 0xff) != 0));
          auVar18._0_8_ = auVar18._0_8_ + auVar20._0_8_;
          auVar18._8_8_ = lVar25 + auVar20._8_8_;
          auVar14._0_8_ = auVar14._0_8_ + auVar20._0_8_;
          auVar14._8_8_ = lVar32 + auVar20._8_8_;
          lVar7 = lVar7 + -4;
          auVar11 = auVar24;
        } while (lVar7 != 0);
        break;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                         ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                         "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00623411;
      *puVar6 = 0;
      pp_Var8 = opnd[2]._vptr_Opnd;
      uVar5 = (ulong)pp_Var8 & 0x1ffff00000000;
    }
    if ((uVar5 == 0x1000000000000) || (((ulong)pp_Var8 & 0xffff000000000000) != 0x1000000000000)) {
      if (((ulong)pp_Var8 & 0xffff000000000000) != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        error = "(Is(aValue))";
        message = "Ensure var is actually a \'TaggedInt\'";
        lineNumber = 0x43;
        goto LAB_00623298;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      lineNumber = 0x2a;
LAB_00623298:
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                         ,lineNumber,error,message);
      uVar5 = CONCAT71(extraout_var_01,bVar2);
      if (!bVar2) {
LAB_00623411:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    uVar4 = (undefined4)uVar5;
    auVar11 = pmovzxbd(ZEXT416((uint)pp_Var8),ZEXT416((uint)pp_Var8));
LAB_006232b5:
    auVar20._0_4_ = -(uint)(auVar11._0_4_ == 0xff);
    auVar20._4_4_ = -(uint)(auVar11._4_4_ == 0xff);
    auVar20._8_4_ = -(uint)(auVar11._8_4_ == 0xff);
    auVar20._12_4_ = -(uint)(auVar11._12_4_ == 0xff);
    auVar17._0_4_ = -(uint)(0 < auVar11._0_4_);
    auVar17._4_4_ = -(uint)(0 < auVar11._4_4_);
    auVar17._8_4_ = -(uint)(0 < auVar11._8_4_);
    auVar17._12_4_ = -(uint)(0 < auVar11._12_4_);
    uVar4 = movmskps(uVar4,~auVar20 & auVar17);
    return POPCOUNT(uVar4);
  case OpndKindIndir:
    OVar3 = IR::Opnd::GetKind(opnd);
    uVar4 = (undefined4)CONCAT71(extraout_var,OVar3);
    auVar11 = extraout_XMM0;
    if (OVar3 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      uVar4 = (undefined4)CONCAT71(extraout_var_00,bVar2);
      if (!bVar2) goto LAB_00623411;
      *puVar6 = 0;
      auVar11 = extraout_XMM0_00;
    }
    auVar11 = pmovzxbd(auVar11,*(undefined4 *)&opnd[2]._vptr_Opnd);
    goto LAB_006232b5;
  }
  auVar11 = phaddd(auVar24,auVar24);
  auVar11 = phaddd(auVar11,auVar11);
  return auVar11._0_4_;
}

Assistant:

uint
Security::CalculateConstSize(IR::Opnd *opnd)
{
    if (DontEncode(opnd))
    {
        return 0;
    }
    switch (opnd->GetKind())
    {
#if TARGET_64
    case IR::OpndKindInt64Const:
    {
        IR::Int64ConstOpnd *intConstOpnd = opnd->AsInt64ConstOpnd();
        return GetByteCount(intConstOpnd->GetValue());
    }
#endif
    case IR::OpndKindIntConst:
    {
        IR::IntConstOpnd *intConstOpnd = opnd->AsIntConstOpnd();
        return GetByteCount(intConstOpnd->GetValue());
    }
    case IR::OpndKindAddr:
    {
        IR::AddrOpnd *addrOpnd = opnd->AsAddrOpnd();
        return Js::TaggedInt::Is(addrOpnd->m_address) ? GetByteCount(Js::TaggedInt::ToInt32(addrOpnd->m_address)) : GetByteCount((intptr_t)addrOpnd->m_address);
    }
    case IR::OpndKindIndir:
    {
        IR::IndirOpnd * indirOpnd = opnd->AsIndirOpnd();
        return GetByteCount(indirOpnd->GetOffset());
    }
    default:
        Assume(UNREACHED);
    }
    return 0;
}